

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::OneHotEncoder::SharedCtor(OneHotEncoder *this)

{
  OneHotEncoder *this_local;
  
  memset(&this->outputsparse_,0,8);
  clear_has_CategoryType(this);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void OneHotEncoder::SharedCtor() {
  ::memset(&outputsparse_, 0, reinterpret_cast<char*>(&handleunknown_) -
    reinterpret_cast<char*>(&outputsparse_) + sizeof(handleunknown_));
  clear_has_CategoryType();
  _cached_size_ = 0;
}